

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O1

void __thiscall testing::UnitTest::PushGTestTrace(UnitTest *this,TraceInfo *trace)

{
  vector<testing::internal::TraceInfo,_std::allocator<testing::internal::TraceInfo>_> *this_00;
  
  internal::MutexBase::Lock(&(this->mutex_).super_MutexBase);
  this_00 = internal::
            ThreadLocal<std::vector<testing::internal::TraceInfo,_std::allocator<testing::internal::TraceInfo>_>_>
            ::GetOrCreateValue(&this->impl_->gtest_trace_stack_);
  std::vector<testing::internal::TraceInfo,_std::allocator<testing::internal::TraceInfo>_>::
  push_back(this_00,trace);
  internal::MutexBase::Unlock(&(this->mutex_).super_MutexBase);
  return;
}

Assistant:

GTEST_LOCK_EXCLUDED_(mutex_) {
  internal::MutexLock lock(&mutex_);
  impl_->gtest_trace_stack().push_back(trace);
}